

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustum.h
# Opt level: O0

float __thiscall
Imath_3_2::Frustum<float>::worldRadiusExc(Frustum<float> *this,Vec3<float> *p,float radius)

{
  domain_error *this_00;
  long in_RSI;
  long in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  float fVar3;
  
  fVar1 = abs<float>(-*(float *)(in_RDI + 8));
  if (fVar1 <= 1.0) {
    fVar1 = abs<float>(*(float *)(in_RSI + 8));
    fVar2 = std::numeric_limits<float>::max();
    fVar3 = abs<float>(-*(float *)(in_RDI + 8));
    if (fVar2 * fVar3 <= fVar1) {
      this_00 = (domain_error *)__cxa_allocate_exception(0x10);
      std::domain_error::domain_error
                (this_00,"Bad viewing frustum: near clipping plane is too close to zero");
      __cxa_throw(this_00,&std::domain_error::typeinfo,std::domain_error::~domain_error);
    }
  }
  return in_XMM0_Da * (*(float *)(in_RSI + 8) / -*(float *)(in_RDI + 8));
}

Assistant:

IMATH_CONSTEXPR14 T
Frustum<T>::worldRadiusExc (const Vec3<T>& p, T radius) const
{
    if (abs (-_nearPlane) > T (1) ||
        abs (p.z) < std::numeric_limits<T>::max () * abs (-_nearPlane))
    {
        return radius * (p.z / -_nearPlane);
    }
    else
    {
        throw std::domain_error ("Bad viewing frustum: "
                                 "near clipping plane is too close to zero");
    }
}